

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.h
# Opt level: O1

void __thiscall Server::echo_handler(Server *this,connection_hdl *hdl,message_ptr *msg)

{
  _Atomic_word *p_Var1;
  value_t vVar2;
  element_type *peVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
  *this_00;
  json_value jVar4;
  Server *this_01;
  bool bVar5;
  ostream *poVar6;
  reference pvVar7;
  float *pfVar8;
  _Base_ptr p_Var9;
  size_type sVar10;
  const_iterator cVar11;
  _Rb_tree_node_base *p_Var12;
  json_value *this_02;
  int jj;
  long lVar13;
  size_type idx;
  json_value jVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  int iVar16;
  key_type *this_03;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *this_04;
  initializer_list_t init;
  json u;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>
  t;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  j;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>
  t_1;
  Vector3f v;
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [8];
  json_value local_1d0;
  key_type local_1c8;
  undefined8 local_1a8;
  _Base_ptr p_Stack_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [8];
  json_value local_180;
  ulong local_178;
  connection_hdl *local_170;
  Server *local_168;
  _Rb_tree_node_base *local_160;
  json_value local_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_138;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_128;
  undefined1 local_120;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_118;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_108;
  undefined1 local_100;
  Vector3f local_f4;
  element_type *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  element_type *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  _Rb_tree_node_base *local_b0;
  undefined1 local_a8 [8];
  json_value local_a0;
  undefined1 local_98 [8];
  json_value local_90;
  undefined1 local_88 [8];
  json_value local_80;
  undefined1 local_78 [8];
  json_value local_70;
  undefined1 local_68 [8];
  json_value local_60;
  _Any_data local_58;
  code *pcStack_48;
  undefined8 uStack_40;
  
  peVar3 = (msg->
           super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(peVar3->m_payload)._M_dataplus._M_p,
                      (peVar3->m_payload)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  peVar3 = (msg->
           super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  first._M_current = (peVar3->m_payload)._M_dataplus._M_p;
  nlohmann::detail::input_adapter::
  input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
            ((input_adapter *)&local_158,first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(first._M_current + (peVar3->m_payload)._M_string_length));
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  pcStack_48 = (code *)0x0;
  uStack_40 = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)local_198,(input_adapter *)&local_158,(parser_callback_t *)&local_58,true);
  if (pcStack_48 != (code *)0x0) {
    (*pcStack_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  pvVar7 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_198,"type");
  bVar5 = nlohmann::operator==<const_char_*,_0>(pvVar7,"query");
  if (bVar5) {
    local_1f8._0_4_ = local_1f8._0_4_ & 0xffffff00;
    local_1f8._8_8_ = 0;
    local_170 = hdl;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_1f8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_1f8);
    p_Var9 = (this->v)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var12 = &(this->v)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_168 = this;
    if (p_Var9 != p_Var12) {
      local_160 = p_Var12;
      do {
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c8,*(long *)(p_Var9 + 1),
                   (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
        local_1a8 = *(undefined8 *)(p_Var9 + 2);
        p_Stack_1a0 = p_Var9[2]._M_parent;
        if ((int)local_1a8 == 0) {
          local_1d0 = (json_value)(long)(int)p_Stack_1a0->_M_color;
          local_1d8[0] = number_integer;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_1d8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_1d8);
          pvVar7 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)local_1f8,"result");
          pvVar7 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::operator[](pvVar7,&local_1c8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_1d8);
          vVar2 = pvVar7->m_type;
          pvVar7->m_type = local_1d8[0];
          jVar14 = pvVar7->m_value;
          pvVar7->m_value = local_1d0;
          local_1d8[0] = vVar2;
          local_1d0 = jVar14;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant(pvVar7);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_1d8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy
                    ((json_value *)
                     &((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_1d8)->m_value,local_1d8[0]);
          p_Var12 = local_160;
        }
        else if ((int)local_1a8 == 1) {
          local_1f8._24_8_ = (undefined8)(float)p_Stack_1a0->_M_color;
          local_1f8[0x10] = number_float;
          local_158.number_float = (number_float_t)local_1f8._24_8_;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)&((key_type *)local_1f8)->field_2);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)&((key_type *)local_1f8)->field_2);
          pvVar7 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)local_1f8,"result");
          pvVar7 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::operator[](pvVar7,&local_1c8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)&((key_type *)local_1f8)->field_2);
          vVar2 = pvVar7->m_type;
          pvVar7->m_type = local_1f8[0x10];
          jVar14 = pvVar7->m_value;
          pvVar7->m_value = (json_value)local_1f8._24_8_;
          local_1f8[0x10] = vVar2;
          local_1f8._24_8_ = jVar14;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant(pvVar7);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)&((key_type *)local_1f8)->field_2);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy
                    ((json_value *)((long)(((key_type *)local_1f8)->field_2)._M_local_buf + 8),
                     local_1f8[0x10]);
        }
        else if ((int)local_1a8 == 2) {
          Vector3f::Vector3f(&local_f4,(Vector3f *)p_Stack_1a0);
          pfVar8 = Vector3f::operator[](&local_f4,0);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json<float_&,_float,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)&local_158,pfVar8);
          local_148._M_local_buf[8] = '\x01';
          local_148._M_allocated_capacity = (size_type)&local_158;
          pfVar8 = Vector3f::operator[](&local_f4,1);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json<float_&,_float,_0>(&local_138,pfVar8);
          local_120 = 1;
          local_128 = &local_138;
          pfVar8 = Vector3f::operator[](&local_f4,2);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json<float_&,_float,_0>(&local_118,pfVar8);
          local_100 = 1;
          init._M_len = 3;
          init._M_array = (iterator)&local_158;
          local_108 = &local_118;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_188,init,true,array);
          pvVar7 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)local_1f8,"result");
          pvVar7 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::operator[](pvVar7,&local_1c8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_188);
          vVar2 = pvVar7->m_type;
          pvVar7->m_type = local_188[0];
          jVar14 = pvVar7->m_value;
          pvVar7->m_value = local_180;
          local_188[0] = vVar2;
          local_180 = jVar14;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant(pvVar7);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_188);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy
                    ((json_value *)
                     &((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_188)->m_value,local_188[0]);
          lVar13 = -0x60;
          this_04 = &local_118;
          do {
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant(this_04);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::json_value::destroy((json_value *)&(this_04->m_value).boolean,this_04->m_type);
            this_04 = this_04 + -2;
            lVar13 = lVar13 + 0x20;
          } while (lVar13 != 0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p);
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while (p_Var9 != p_Var12);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<const_char_(&)[6],_char[6],_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_68,(char (*) [6])"query");
    pvVar7 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_1f8,"type");
    this_01 = local_168;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_68);
    vVar2 = pvVar7->m_type;
    pvVar7->m_type = local_68[0];
    jVar14 = pvVar7->m_value;
    pvVar7->m_value = local_60;
    local_68[0] = vVar2;
    local_60 = jVar14;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant(pvVar7);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_68);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy
              ((json_value *)
               &((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_68)->m_value,local_68[0]);
    p_Var15 = (local_170->super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    local_c8 = (local_170->super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Stack_c0 = (local_170->super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var15->_M_weak_count = p_Var15->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Var15->_M_weak_count = p_Var15->_M_weak_count + 1;
      }
    }
    iVar16 = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump(&local_1c8,
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)local_1f8,-1,' ',false,strict);
    std::__cxx11::string::string
              ((string *)&local_158.boolean,local_1c8._M_dataplus._M_p,(allocator *)&local_f4);
    websocketpp::
    endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>::send
              ((endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
                *)this_01,(int)&local_c8,&local_158,1,iVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.object != &local_148) {
      operator_delete(local_158.object);
    }
    p_Var15 = p_Stack_c0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p);
      p_Var15 = p_Stack_c0;
    }
LAB_00181c2b:
    this_02 = (json_value *)&((key_type *)local_1f8)->_M_string_length;
    this_03 = (key_type *)local_1f8;
    if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var15->_M_weak_count;
        iVar16 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar16 = p_Var15->_M_weak_count;
        p_Var15->_M_weak_count = iVar16 + -1;
      }
      this_03 = (key_type *)local_1f8;
      if (iVar16 == 1) {
        (*p_Var15->_vptr__Sp_counted_base[3])();
        this_03 = (key_type *)local_1f8;
      }
    }
  }
  else {
    pvVar7 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_198,"type");
    bVar5 = nlohmann::operator==<const_char_*,_0>(pvVar7,"shade");
    if (bVar5) {
      (*this->f)(this->k);
      this->k = true;
      local_1f8._0_4_ = local_1f8._0_4_ & 0xffffff00;
      local_1f8._8_8_ = 0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_1f8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_1f8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json<const_char_(&)[6],_char[6],_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_78,(char (*) [6])"shade");
      pvVar7 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_1f8,"type");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_78);
      vVar2 = pvVar7->m_type;
      pvVar7->m_type = local_78[0];
      jVar14 = pvVar7->m_value;
      pvVar7->m_value = local_70;
      local_78[0] = vVar2;
      local_70 = jVar14;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant(pvVar7);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_78);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy
                ((json_value *)
                 &((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_78)->m_value,local_78[0]);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json<const_char_(&)[8],_char[8],_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_88,(char (*) [8])"succeed");
      pvVar7 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_1f8,"result");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_88);
      vVar2 = pvVar7->m_type;
      pvVar7->m_type = local_88[0];
      jVar14 = pvVar7->m_value;
      pvVar7->m_value = local_80;
      local_88[0] = vVar2;
      local_80 = jVar14;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant(pvVar7);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_88);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy
                ((json_value *)
                 &((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_88)->m_value,local_88[0]);
      p_Var15 = (hdl->super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      local_d8 = (hdl->super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Stack_d0 = (hdl->super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var15->_M_weak_count = p_Var15->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          p_Var15->_M_weak_count = p_Var15->_M_weak_count + 1;
        }
      }
      iVar16 = 0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::dump(&local_1c8,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_1f8,-1,' ',false,strict);
      std::__cxx11::string::string
                ((string *)&local_158.boolean,local_1c8._M_dataplus._M_p,(allocator *)&local_f4);
      websocketpp::
      endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>::send
                ((endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
                  *)this,(int)&local_d8,&local_158,1,iVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.object != &local_148) {
        operator_delete(local_158.object);
      }
      p_Var15 = p_Stack_d0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
        p_Var15 = p_Stack_d0;
      }
      goto LAB_00181c2b;
    }
    pvVar7 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_198,"type");
    bVar5 = nlohmann::operator==<const_char_*,_0>(pvVar7,"edit_parameters");
    if (!bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"unsupported request ",0x14);
      pvVar7 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_198,"type");
      poVar6 = nlohmann::operator<<((ostream *)&std::cerr,pvVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      goto LAB_00181c73;
    }
    this->k = false;
    sVar10 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::count<char_const(&)[6]>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_198,(char (*) [6])"param");
    if (sVar10 == 0) {
      jVar14.object = (object_t *)0x0;
    }
    else {
      p_Var12 = (this->v)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_b0 = &(this->v)._M_t._M_impl.super__Rb_tree_header._M_header;
      jVar14.object = (object_t *)0x0;
      if (p_Var12 != local_b0) {
        local_178 = 0;
        local_170 = hdl;
        local_168 = this;
        do {
          local_158.object = (object_t *)&local_148;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_158,*(long *)(p_Var12 + 1),
                     (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1));
          local_138._0_8_ = *(undefined8 *)(p_Var12 + 2);
          local_138.m_value = (json_value)p_Var12[2]._M_parent;
          pvVar7 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)local_198,"param");
          if ((pvVar7->m_type == object) &&
             (this_00 = &((pvVar7->m_value).object)->_M_t,
             cVar11 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
                      ::find(this_00,(key_type *)&local_158),
             (_Rb_tree_header *)cVar11._M_node != &(this_00->_M_impl).super__Rb_tree_header)) {
            local_178 = (ulong)((int)local_178 + 1);
            if (local_138._0_4_ == 2) {
              Vector3f::Vector3f((Vector3f *)&local_1c8,0.0);
              idx = 0;
              do {
                pvVar7 = nlohmann::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         ::operator[]<char_const>
                                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                     *)local_198,"param");
                pvVar7 = nlohmann::
                         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         ::operator[](pvVar7,(key_type *)&local_158);
                pvVar7 = nlohmann::
                         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         ::operator[](pvVar7,idx);
                nlohmann::detail::
                from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
                          (pvVar7,(float *)local_1f8);
                local_160 = (_Rb_tree_node_base *)CONCAT44(local_160._4_4_,local_1f8._0_4_);
                pfVar8 = Vector3f::operator[]((Vector3f *)&local_1c8,(int)idx);
                *pfVar8 = local_160._0_4_;
                idx = idx + 1;
              } while (idx != 3);
              Vector3f::operator=((Vector3f *)local_138.m_value.object,(Vector3f *)&local_1c8);
            }
            else if (local_138._0_4_ == 1) {
              pvVar7 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)local_198,"param");
              pvVar7 = nlohmann::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       ::operator[](pvVar7,(key_type *)&local_158);
              nlohmann::detail::
              from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
                        (pvVar7,(float *)&local_1c8);
              *(_Rb_tree_color *)&((local_138.m_value.object)->_M_t)._M_impl =
                   (_Rb_tree_color)local_1c8._M_dataplus._M_p;
            }
            else if (local_138._0_4_ == 0) {
              pvVar7 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)local_198,"param");
              pvVar7 = nlohmann::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       ::operator[](pvVar7,(key_type *)&local_158);
              nlohmann::detail::
              from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                        (pvVar7,(int *)&local_1c8);
              *(_Rb_tree_color *)&((local_138.m_value.object)->_M_t)._M_impl =
                   (_Rb_tree_color)local_1c8._M_dataplus._M_p;
            }
          }
          if (local_158.object != (object_t *)&local_148) {
            operator_delete(local_158.object);
          }
          p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
        } while (p_Var12 != local_b0);
        jVar14 = (json_value)(long)(int)local_178;
        hdl = local_170;
        this = local_168;
      }
    }
    local_1c8._M_dataplus._M_p = local_1c8._M_dataplus._M_p & 0xffffffffffffff00;
    local_1c8._M_string_length = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)&local_1c8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)&local_1c8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<const_char_(&)[16],_char[16],_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_98,(char (*) [16])"edit_parameters");
    pvVar7 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&local_1c8,"type");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_98);
    vVar2 = pvVar7->m_type;
    pvVar7->m_type = local_98[0];
    jVar4 = pvVar7->m_value;
    pvVar7->m_value = local_90;
    local_98[0] = vVar2;
    local_90 = jVar4;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant(pvVar7);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_98);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy
              ((json_value *)
               &((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_98)->m_value,local_98[0]);
    local_a8[0] = number_integer;
    local_a0 = jVar14;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_a8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_a8);
    pvVar7 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&local_1c8,"result");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_a8);
    vVar2 = pvVar7->m_type;
    pvVar7->m_type = local_a8[0];
    jVar14 = pvVar7->m_value;
    pvVar7->m_value = local_a0;
    local_a8[0] = vVar2;
    local_a0 = jVar14;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant(pvVar7);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_a8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy
              ((json_value *)
               &((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_a8)->m_value,local_a8[0]);
    p_Var15 = (hdl->super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    local_e8 = (hdl->super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Stack_e0 = (hdl->super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var15->_M_weak_count = p_Var15->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Var15->_M_weak_count = p_Var15->_M_weak_count + 1;
      }
    }
    iVar16 = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump((string_t *)&local_158,
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)&local_1c8,-1,' ',false,strict);
    websocketpp::
    endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>::send
              ((endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
                *)this,(int)&local_e8,&local_158,1,iVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.object != &local_148) {
      operator_delete(local_158.object);
    }
    this_02 = (json_value *)&local_1c8._M_string_length;
    if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Stack_e0->_M_weak_count;
        iVar16 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar16 = p_Stack_e0->_M_weak_count;
        p_Stack_e0->_M_weak_count = iVar16 + -1;
      }
      if (iVar16 == 1) {
        (*p_Stack_e0->_vptr__Sp_counted_base[3])();
      }
    }
    this_03 = &local_1c8;
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)this_03);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy(this_02,*(value_t *)&(this_03->_M_dataplus)._M_p);
LAB_00181c73:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_198);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_198 + 8),(value_t)local_198[0]);
  return;
}

Assistant:

void echo_handler(websocketpp::connection_hdl hdl, server::message_ptr msg) {
		std::cerr << (msg->get_payload()) << std::endl;
		auto j = json::parse(msg->get_payload());
		if (j["type"] == "query")
		{
			json u;
			for (auto t : v)
			{
				const std::pair<ParamType, void*>& p = t.second;
				switch (p.first)
				{
				case PT_INT:
					u["result"][t.first] = int(*((int*)p.second)); break;
				case PT_FLOAT:
					u["result"][t.first] = float(*((float*)p.second)); break;
				case PT_VECTOR3F:
					Vector3f v = Vector3f(*((Vector3f*)p.second));
					u["result"][t.first] = { v[0],v[1],v[2] }; break;
				}
			}
			u["type"] = "query";
			m_endpoint.send(hdl, u.dump().c_str(), websocketpp::frame::opcode::TEXT);
		}
		else if(j["type"] == "shade")
		{
			f(k); k = 1;
			json u;
			u["type"] = "shade";
			u["result"] = "succeed";
			m_endpoint.send(hdl, u.dump().c_str(), websocketpp::frame::opcode::TEXT);
		}
		else if (j["type"] == "edit_parameters")
		{
			k = 0;
			int edt = 0;
			if(j.count("param"))
			for (auto t : v)
			{
				if (!j["param"].count(t.first)) continue;
				++edt;
				const std::pair<ParamType, void*>& p = t.second;
				switch (p.first)
				{
				case PT_INT:
					*((int*)p.second) = (int)j["param"][t.first]; break;
				case PT_FLOAT:
					*((float*)p.second) = (float)j["param"][t.first]; break;
				case PT_VECTOR3F:
					Vector3f tv;
					for (int jj = 0; jj < 3; ++jj) tv[jj] = (float)j["param"][t.first][jj];
					*((Vector3f*)p.second) = tv; break;
				}
			}
			json tmp;
			tmp["type"] = "edit_parameters";
			tmp["result"] = edt;
			m_endpoint.send(hdl, tmp.dump(), websocketpp::frame::opcode::TEXT);
		}
		else
		{
			std::cerr << "unsupported request "<<j["type"]<<"\n";
		}
	}